

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALCenum alcGetError(ALCdevice *_device)

{
  ALCenum e;
  DeviceWrapper *local_28;
  ALCenum retval;
  DeviceWrapper *device;
  ALCdevice *_device_local;
  
  local_28 = (DeviceWrapper *)_device;
  if (_device == (ALCdevice *)0x0) {
    local_28 = &null_device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetError);
  IO_PTR(_device);
  e = local_28->errorlatch;
  local_28->errorlatch = 0;
  IO_ALCENUM(e);
  check_alc_error_events(local_28);
  check_al_async_states();
  APIUNLOCK();
  return e;
}

Assistant:

ALCenum alcGetError(ALCdevice *_device)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    ALCenum retval;
    IO_START(alcGetError);
    IO_PTR(_device);
    retval = device->errorlatch;
    device->errorlatch = ALC_NO_ERROR;
    IO_ALCENUM(retval);
    IO_END_ALC(device);
    return retval;
}